

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTetrahedronShape.cpp
# Opt level: O2

int __thiscall btBU_Simplex1to4::getNumEdges(btBU_Simplex1to4 *this)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = *(int *)&(this->super_btPolyhedralConvexAabbCachingShape).field_0x74 - 2;
  iVar1 = 0;
  if (uVar2 < 3) {
    iVar1 = *(int *)(&DAT_001b1dd8 + (ulong)uVar2 * 4);
  }
  return iVar1;
}

Assistant:

int btBU_Simplex1to4::getNumEdges() const
{
	//euler formula, F-E+V = 2, so E = F+V-2

	switch (m_numVertices)
	{
	case 0:
		return 0;
	case 1: return 0;
	case 2: return 1;
	case 3: return 3;
	case 4: return 6;


	}

	return 0;
}